

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O2

char * escape_string_for_regex(char *s)

{
  size_t sVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte bVar4;
  
  sVar1 = strlen(s);
  pbVar2 = (byte *)malloc(sVar1 * 2 + 2);
  pbVar3 = pbVar2;
  do {
    bVar4 = *s;
    if ((bVar4 - 0x28 < 0x37) && ((0x7800000080002fU >> ((ulong)(bVar4 - 0x28) & 0x3f) & 1) != 0)) {
      *pbVar3 = 0x5c;
      pbVar3 = pbVar3 + 1;
      bVar4 = *s;
    }
    else if (bVar4 == 0) {
      *pbVar3 = 0;
      return (char *)pbVar2;
    }
    *pbVar3 = bVar4;
    pbVar3 = pbVar3 + 1;
    s = (char *)((byte *)s + 1);
  } while( true );
}

Assistant:

char *escape_string_for_regex(const char *s) {
  char *ss = (char *)MALLOC((strlen(s) + 1) * 2), *sss = ss;
  for (; *s; s++) {
    switch (*s) {
      case '(':
      case ')':
      case '[':
      case ']':
      case '-':
      case '^':
      case '*':
      case '?':
      case '+':
      case '\\':
        *ss++ = '\\';
        /* fall through */
      default:
        *ss++ = *s;
        break;
    }
  }
  *ss = 0;
  return sss;
}